

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_interp_face_only
          (REF_INTERP ref_interp,REF_INT faceid,REF_INT leading_dim,REF_DBL *from_scalar,
          REF_DBL *to_scalar)

{
  REF_CELL pRVar1;
  REF_GRID ref_grid;
  REF_MPI pRVar2;
  REF_GLOB *pRVar3;
  REF_BOOL RVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  REF_INT *proc;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  REF_DBL *pRVar12;
  size_t __size;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  REF_NODE pRVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  uint local_13c;
  REF_INT n_recept;
  uint local_134;
  REF_INT n_donor;
  REF_BOOL increase_fuzz;
  REF_MPI local_128;
  REF_INT *recept_node;
  REF_GLOB *l2c;
  void *local_110;
  void *local_108;
  REF_NODE local_100;
  REF_INT *donor_ret;
  REF_CELL local_f0;
  REF_DBL *local_e8;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_scalar;
  REF_DBL *local_c0;
  REF_LONG ncell;
  REF_GLOB nnode;
  REF_INT nodes [27];
  
  pRVar1 = ref_interp->from_tet;
  ref_grid = ref_interp->to_grid;
  pRVar2 = ref_grid->mpi;
  pRVar16 = ref_grid->node;
  local_e8 = to_scalar;
  local_13c = ref_grid_compact_surf_id_nodes(ref_grid,faceid,&nnode,&ncell,&l2c);
  if (local_13c != 0) {
    pcVar13 = "l2c";
    uVar9 = 0x8a0;
LAB_0016f575:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar9,
           "ref_interp_face_only",(ulong)local_13c,pcVar13);
    return local_13c;
  }
  if (0 < pRVar16->max) {
    pRVar3 = pRVar16->global;
    lVar10 = 0;
    do {
      if ((-1 < pRVar3[lVar10]) &&
         ((l2c[lVar10] == -1 || (pRVar16->ref_mpi->id != pRVar16->part[lVar10])))) {
        ref_interp->cell[lVar10] = -0x39;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pRVar16->max);
  }
  increase_fuzz = 0;
  iVar15 = 0xb;
  local_134 = leading_dim;
  local_128 = pRVar2;
  local_100 = pRVar16;
  local_f0 = pRVar1;
  local_c0 = from_scalar;
  do {
    if ((increase_fuzz != 0) &&
       (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, local_128->id == 0)) {
      printf("retry tree search with %e fuzz\n");
    }
    uVar5 = ref_interp_tree(ref_interp,&increase_fuzz);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x8b0,"ref_interp_face_only",(ulong)uVar5,"tree");
      return uVar5;
    }
    if ((ref_interp->instrument != 0) &&
       (uVar5 = ref_mpi_stopwatch_stop(local_128,"tree"), uVar5 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x8b2,"ref_interp_face_only",(ulong)uVar5,"locate clock");
      return uVar5;
    }
    RVar4 = increase_fuzz;
    bVar18 = iVar15 != 0;
    iVar15 = iVar15 + -1;
  } while ((increase_fuzz != 0) && (bVar18));
  lVar10 = (long)increase_fuzz;
  if (lVar10 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x8b5,
           "ref_interp_face_only","unable to grow fuzz to find tree candidate",0,lVar10);
  }
  pRVar16 = local_100;
  local_13c = (uint)(lVar10 != 0);
  if (RVar4 != 0) {
    return local_13c;
  }
  if (0 < local_100->max) {
    pRVar3 = local_100->global;
    lVar10 = 0;
    do {
      if ((-1 < pRVar3[lVar10]) &&
         ((l2c[lVar10] == -1 || (local_100->ref_mpi->id != local_100->part[lVar10])))) {
        ref_interp->cell[lVar10] = -1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_100->max);
  }
  n_recept = 0;
  if (0 < local_100->max) {
    iVar15 = 0;
    lVar10 = 0;
    do {
      if (((-1 < local_100->global[lVar10]) && (l2c[lVar10] != -1)) &&
         (local_100->ref_mpi->id == local_100->part[lVar10])) {
        iVar15 = iVar15 + 1;
        n_recept = iVar15;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_100->max);
  }
  lVar10 = (long)n_recept;
  if (lVar10 < 0) {
    pcVar13 = "malloc recept_bary of REF_DBL negative";
    uVar9 = 0x8c4;
LAB_0016fae0:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar9,
           "ref_interp_face_only",pcVar13);
    local_13c = 1;
  }
  else {
    pvVar6 = malloc((ulong)(uint)(n_recept * 4) << 3);
    if (pvVar6 == (void *)0x0) {
      pcVar13 = "malloc recept_bary of REF_DBL NULL";
      uVar9 = 0x8c4;
    }
    else {
      __size = lVar10 << 2;
      pvVar7 = malloc(__size);
      if (pvVar7 == (void *)0x0) {
        pcVar13 = "malloc recept_cell of REF_INT NULL";
        uVar9 = 0x8c5;
      }
      else {
        recept_node = (REF_INT *)malloc(__size);
        if (recept_node == (REF_INT *)0x0) {
          pcVar13 = "malloc recept_node of REF_INT NULL";
          uVar9 = 0x8c6;
        }
        else {
          local_108 = malloc(__size);
          if (local_108 == (void *)0x0) {
            pcVar13 = "malloc recept_ret of REF_INT NULL";
            uVar9 = 0x8c7;
          }
          else {
            proc = (REF_INT *)malloc(__size);
            if (proc == (REF_INT *)0x0) {
              pcVar13 = "malloc recept_proc of REF_INT NULL";
              uVar9 = 0x8c8;
            }
            else {
              n_recept = 0;
              local_110 = pvVar7;
              if (0 < pRVar16->max) {
                lVar10 = 0;
                lVar17 = 0;
                do {
                  if (((-1 < pRVar16->global[lVar17]) && (l2c[lVar17] != -1)) &&
                     (pRVar16->ref_mpi->id == pRVar16->part[lVar17])) {
                    if (ref_interp->cell[lVar17] == -1) {
                      pcVar13 = "node needs to be localized";
                      uVar9 = 0x8cd;
                      goto LAB_0016fae0;
                    }
                    uVar5 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar10),
                                                (REF_DBL *)((long)n_recept * 0x20 + (long)pvVar6));
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x8d0,"ref_interp_face_only",(ulong)uVar5,"clip");
                      return uVar5;
                    }
                    lVar8 = (long)n_recept;
                    proc[lVar8] = ref_interp->part[lVar17];
                    *(REF_INT *)((long)local_110 + lVar8 * 4) = ref_interp->cell[lVar17];
                    recept_node[lVar8] = (REF_INT)lVar17;
                    *(REF_INT *)((long)local_108 + (long)n_recept * 4) = local_128->id;
                    n_recept = n_recept + 1;
                    pRVar16 = local_100;
                  }
                  lVar17 = lVar17 + 1;
                  lVar10 = lVar10 + 0x20;
                } while (lVar17 < pRVar16->max);
              }
              if (l2c != (REF_GLOB *)0x0) {
                free(l2c);
              }
              pRVar2 = local_128;
              uVar5 = ref_mpi_blindsend(local_128,proc,local_110,1,n_recept,&donor_cell,&n_donor,1);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x8dd,"ref_interp_face_only",(ulong)uVar5,"blind send cell");
                return uVar5;
              }
              uVar5 = ref_mpi_blindsend(pRVar2,proc,local_108,1,n_recept,&donor_ret,&n_donor,1);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x8e0,"ref_interp_face_only",(ulong)uVar5,"blind send ret");
                return uVar5;
              }
              uVar5 = ref_mpi_blindsend(pRVar2,proc,recept_node,1,n_recept,&donor_node,&n_donor,1);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x8e3,"ref_interp_face_only",(ulong)uVar5,"blind send node");
                return uVar5;
              }
              uVar5 = ref_mpi_blindsend(pRVar2,proc,pvVar6,4,n_recept,&donor_bary,&n_donor,3);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x8e6,"ref_interp_face_only",(ulong)uVar5,"blind send bary");
                return uVar5;
              }
              free(proc);
              free(local_108);
              if (recept_node != (REF_INT *)0x0) {
                free(recept_node);
              }
              free(local_110);
              free(pvVar6);
              if ((int)(n_donor * local_134) < 0) {
                pcVar13 = "malloc donor_scalar of REF_DBL negative";
                uVar9 = 0x8ee;
                goto LAB_0016fae0;
              }
              pvVar6 = malloc((ulong)(n_donor * local_134) << 3);
              if (pvVar6 != (void *)0x0) {
                if (0 < n_donor) {
                  uVar14 = (ulong)local_134;
                  lVar10 = 0;
                  do {
                    uVar5 = ref_cell_nodes(local_f0,donor_cell[lVar10],nodes);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x8f2,"ref_interp_face_only",(ulong)uVar5,"node needs to be localized"
                            );
                      return uVar5;
                    }
                    if (0 < (int)local_134) {
                      lVar17 = lVar10 * uVar14;
                      uVar11 = 0;
                      do {
                        *(undefined8 *)((long)pvVar6 + uVar11 * 8 + lVar17 * 8) = 0;
                        dVar19 = 0.0;
                        lVar8 = 0;
                        do {
                          dVar19 = dVar19 + donor_bary
                                            [(ulong)((uint)lVar10 & 0x3fffffff) * 4 + lVar8] *
                                            local_c0[(int)(nodes[lVar8] * local_134 + (int)uVar11)];
                          *(double *)((long)pvVar6 + uVar11 * 8 + lVar17 * 8) = dVar19;
                          lVar8 = lVar8 + 1;
                        } while (lVar8 != 4);
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != uVar14);
                    }
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < n_donor);
                }
                if (donor_cell != (REF_INT *)0x0) {
                  free(donor_cell);
                }
                if (donor_bary != (REF_DBL *)0x0) {
                  free(donor_bary);
                }
                uVar5 = ref_mpi_blindsend(local_128,donor_ret,pvVar6,local_134,n_donor,
                                          &recept_scalar,&n_recept,3);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x902,"ref_interp_face_only",(ulong)uVar5,"blind send bary");
                  return uVar5;
                }
                uVar5 = ref_mpi_blindsend(local_128,donor_ret,donor_node,1,n_donor,&recept_node,
                                          &n_recept,1);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x905,"ref_interp_face_only",(ulong)uVar5);
                  return uVar5;
                }
                free(pvVar6);
                if (donor_node != (REF_INT *)0x0) {
                  free(donor_node);
                }
                if (donor_ret != (REF_INT *)0x0) {
                  free(donor_ret);
                }
                if (0 < (long)n_recept) {
                  lVar10 = 0;
                  pRVar12 = recept_scalar;
                  do {
                    if (0 < (int)local_134) {
                      iVar15 = recept_node[lVar10];
                      uVar14 = 0;
                      do {
                        local_e8[(long)iVar15 * (long)(int)local_134 + uVar14] = pRVar12[uVar14];
                        uVar14 = uVar14 + 1;
                      } while (local_134 != uVar14);
                    }
                    lVar10 = lVar10 + 1;
                    pRVar12 = pRVar12 + (int)local_134;
                  } while (lVar10 != n_recept);
                }
                if (recept_node != (REF_INT *)0x0) {
                  free(recept_node);
                }
                if (recept_scalar != (REF_DBL *)0x0) {
                  free(recept_scalar);
                }
                local_13c = ref_node_ghost_dbl(local_100,local_e8,local_134);
                if (local_13c == 0) {
                  return 0;
                }
                pcVar13 = "ghost";
                uVar9 = 0x915;
                goto LAB_0016f575;
              }
              pcVar13 = "malloc donor_scalar of REF_DBL NULL";
              uVar9 = 0x8ee;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar9,
           "ref_interp_face_only",pcVar13);
    local_13c = 2;
  }
  return local_13c;
}

Assistant:

REF_FCN REF_STATUS ref_interp_face_only(REF_INTERP ref_interp, REF_INT faceid,
                                        REF_INT leading_dim,
                                        REF_DBL *from_scalar,
                                        REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell = ref_interp_from_tet(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_BOOL increase_fuzz;
  REF_INT tries;

  RSS(ref_grid_compact_surf_id_nodes(to_grid, faceid, &nnode, &ncell, &l2c),
      "l2c");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = -57; /* magic number to skip */
    }
  }

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = REF_EMPTY; /* set back */
    }
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  ref_free(l2c);

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");

  return REF_SUCCESS;
}